

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,Option *opt)

{
  int *piVar1;
  size_t sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  void *pvVar6;
  Allocator *pAVar7;
  Allocator *pAVar8;
  size_t sVar9;
  size_t sVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  int n_1;
  void *pvVar13;
  void *pvVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int *piVar18;
  void *pvVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  void *pvVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  int iVar38;
  uint uVar39;
  undefined1 auVar37 [16];
  int iVar40;
  int iVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  void *local_410;
  void *local_400;
  void *local_3f8;
  int *local_3e8;
  int *local_3d0;
  void *local_3b0;
  float w4 [6];
  float w3 [6];
  float w2 [6];
  float w1 [6];
  undefined1 local_328 [56];
  size_t local_2f0;
  Mat top_blob_bordered;
  uint uStack_24c;
  float t2 [6];
  float t1 [6];
  float t0 [6];
  float w5 [6];
  float w0 [6];
  float d1 [6];
  int tiles;
  float t5 [6];
  float t4 [6];
  float t3 [6];
  int local_f8;
  int iStack_f4;
  float d5 [6];
  float d4 [6];
  float d3 [6];
  float d2 [6];
  
  uVar3 = top_blob->w;
  uVar4 = top_blob->h;
  uVar5 = top_blob->c;
  local_328._0_8_ = bottom_blob->data;
  piVar18 = bottom_blob->refcount;
  local_328._8_4_ = SUB84(piVar18,0);
  local_328._12_4_ = (undefined4)((ulong)piVar18 >> 0x20);
  local_328._16_8_ = bottom_blob->elemsize;
  local_328._24_4_ = bottom_blob->packing;
  local_328._32_8_ = bottom_blob->allocator;
  uVar11 = bottom_blob->c;
  local_328._40_4_ = bottom_blob->dims;
  local_328._44_4_ = bottom_blob->w;
  local_328._48_4_ = bottom_blob->h;
  local_328._52_4_ = bottom_blob->c;
  local_2f0 = bottom_blob->cstep;
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + 1;
    UNLOCK();
  }
  iVar35 = uVar3 + 3;
  iVar38 = uVar4 + 3;
  iVar40 = (iVar35 / 4) * 4;
  iVar41 = (iVar38 / 4) * 4;
  copy_make_border(bottom_blob,(Mat *)local_328,0,(iVar41 + 2) - bottom_blob->h,0,
                   (iVar40 + 2) - bottom_blob->w,0,0.0,opt->workspace_allocator,opt->num_threads);
  uVar36 = (int)(((uint)(iVar35 >> 0x1f) >> 0x1e) + iVar35) >> 2;
  uVar39 = (int)(((uint)(iVar38 >> 0x1f) >> 0x1e) + iVar38) >> 2;
  pvVar6 = _bias->data;
  uVar16 = uVar39 * uVar36;
  pAVar7 = opt->workspace_allocator;
  uVar32 = (ulong)(int)(uVar16 * 0x24);
  piVar18 = (int *)(ulong)(uint)uVar11;
  lVar33 = (long)(int)uVar11 * (uVar32 & 0x3ffffffffffffffc);
  if (lVar33 == 0) {
    local_3e8 = (int *)0x0;
    local_410 = (void *)0x0;
  }
  else {
    sVar2 = lVar33 * 4 + 4;
    if (pAVar7 == (Allocator *)0x0) {
      top_blob_bordered.data = (void *)0x0;
      iVar35 = posix_memalign(&top_blob_bordered.data,0x10,sVar2);
      if (iVar35 != 0) {
        top_blob_bordered.data = (void *)0x0;
      }
    }
    else {
      top_blob_bordered.data = (void *)(**(code **)(*(long *)pAVar7 + 0x10))(pAVar7,sVar2);
    }
    piVar18 = (int *)((long)top_blob_bordered.data + lVar33 * 4);
    *(undefined4 *)((long)top_blob_bordered.data + lVar33 * 4) = 1;
    local_410 = top_blob_bordered.data;
    local_3e8 = piVar18;
  }
  if (0 < (int)uVar11) {
    auVar37._0_4_ = -(uint)(0 < (int)uVar3);
    auVar37._4_4_ = -(uint)(0 < (int)uVar3);
    auVar37._8_4_ = -(uint)(0 < (int)uVar4);
    auVar37._12_4_ = -(uint)(0 < (int)uVar4);
    uVar17 = movmskpd((int)piVar18,auVar37);
    uVar24 = 1;
    if (1 < (int)uVar36) {
      uVar24 = uVar36;
    }
    uVar23 = 1;
    if (1 < (int)uVar39) {
      uVar23 = (ulong)uVar39;
    }
    lVar25 = (long)iVar40;
    lVar33 = lVar25 * 4 + 8;
    local_3f8 = (void *)0x0;
    do {
      if ((uVar17 >> 1 & 0x7f) != 0) {
        pvVar13 = (void *)(uVar32 * 4 * (long)local_3f8 + (long)local_410);
        uVar28 = 0;
        do {
          if ((uVar17 & 1) != 0) {
            lVar20 = local_328._0_8_ +
                     (long)((iVar40 + 2) * 4 * (int)uVar28) * 4 +
                     local_2f0 * (long)local_3f8 * local_328._16_8_;
            uVar29 = 0;
            do {
              lVar22 = 0;
              do {
                *(undefined4 *)((long)&top_blob_bordered.data + lVar22) =
                     *(undefined4 *)(lVar20 + lVar22);
                lVar26 = lVar33 * 2 + lVar22;
                *(undefined4 *)((long)d1 + lVar22) =
                     *(undefined4 *)(lVar20 + lVar25 * 4 + lVar22 + 8);
                *(undefined4 *)((long)d2 + lVar22) =
                     *(undefined4 *)(lVar20 + lVar25 * 8 + lVar22 + 0x10);
                lVar31 = lVar33 + lVar26;
                *(undefined4 *)((long)d3 + lVar22) =
                     *(undefined4 *)(lVar20 + lVar25 * 4 + lVar26 + 8);
                *(undefined4 *)((long)d4 + lVar22) =
                     *(undefined4 *)(lVar20 + lVar25 * 4 + lVar31 + 8);
                *(undefined4 *)((long)d5 + lVar22) =
                     *(undefined4 *)(lVar20 + lVar25 * 8 + lVar31 + 0x10);
                lVar22 = lVar22 + 4;
              } while (lVar22 != 0x18);
              lVar22 = 0;
              do {
                fVar42 = *(float *)((long)d2 + lVar22);
                fVar43 = *(float *)((long)d4 + lVar22);
                fVar44 = *(float *)((long)d1 + lVar22);
                fVar49 = *(float *)((long)d3 + lVar22);
                *(float *)((long)w0 + lVar22) =
                     fVar42 * -5.0 + fVar43 +
                     *(float *)((long)&top_blob_bordered.data + lVar22) * 4.0;
                *(float *)((long)w1 + lVar22) = fVar49 + fVar43 + (fVar44 + fVar42) * -4.0;
                *(float *)((long)w2 + lVar22) = (fVar43 - fVar49) + (fVar44 - fVar42) * 4.0;
                *(float *)((long)w3 + lVar22) =
                     ((fVar43 - fVar42) - (fVar44 + fVar44)) + fVar49 + fVar49;
                *(float *)((long)w4 + lVar22) =
                     (fVar44 + fVar44 + fVar43) - (fVar49 + fVar49 + fVar42);
                *(float *)((long)w5 + lVar22) =
                     fVar49 * -5.0 + fVar44 * 4.0 + *(float *)((long)d5 + lVar22);
                lVar22 = lVar22 + 4;
              } while (lVar22 != 0x18);
              t0[0] = w0[0];
              t1[0] = w0[1];
              t2[0] = w0[2];
              t3[0] = w0[3];
              t4[0] = w0[4];
              t5[0] = w0[5];
              t0[1] = w1[0];
              t1[1] = w1[1];
              t2[1] = w1[2];
              t3[1] = w1[3];
              t4[1] = w1[4];
              t5[1] = w1[5];
              t0[2] = w2[0];
              t1[2] = w2[1];
              t2[2] = w2[2];
              t3[2] = w2[3];
              t4[2] = w2[4];
              t5[2] = w2[5];
              t0[3] = w3[0];
              t1[3] = w3[1];
              t2[3] = w3[2];
              t3[3] = w3[3];
              t4[3] = w3[4];
              t5[3] = w3[5];
              t0[4] = w4[0];
              t1[4] = w4[1];
              t2[4] = w4[2];
              t3[4] = w4[3];
              t4[4] = w4[4];
              t5[4] = w4[5];
              t0[5] = w5[0];
              t1[5] = w5[1];
              t2[5] = w5[2];
              t3[5] = w5[3];
              t4[5] = w5[4];
              t5[5] = w5[5];
              lVar22 = 0;
              do {
                fVar42 = *(float *)((long)t2 + lVar22);
                fVar43 = *(float *)((long)t4 + lVar22);
                fVar44 = *(float *)((long)t1 + lVar22);
                fVar49 = *(float *)((long)t3 + lVar22);
                *(float *)((long)&top_blob_bordered.data + lVar22) =
                     fVar42 * -5.0 + fVar43 + *(float *)((long)t0 + lVar22) * 4.0;
                *(float *)((long)d1 + lVar22) = fVar49 + fVar43 + (fVar44 + fVar42) * -4.0;
                *(float *)((long)d2 + lVar22) = (fVar43 - fVar49) + (fVar44 - fVar42) * 4.0;
                *(float *)((long)d3 + lVar22) =
                     ((fVar43 - fVar42) - (fVar44 + fVar44)) + fVar49 + fVar49;
                *(float *)((long)d4 + lVar22) =
                     (fVar44 + fVar44 + fVar43) - (fVar49 + fVar49 + fVar42);
                *(float *)((long)d5 + lVar22) =
                     fVar49 * -5.0 + fVar44 * 4.0 + *(float *)((long)t5 + lVar22);
                lVar22 = lVar22 + 4;
              } while (lVar22 != 0x18);
              lVar22 = 0;
              do {
                *(undefined4 *)((long)pvVar13 + lVar22) =
                     *(undefined4 *)((long)&top_blob_bordered.data + lVar22);
                *(undefined4 *)((long)pvVar13 + lVar22 + 0x18) = *(undefined4 *)((long)d1 + lVar22);
                *(undefined4 *)((long)pvVar13 + lVar22 + 0x30) = *(undefined4 *)((long)d2 + lVar22);
                *(undefined4 *)((long)pvVar13 + lVar22 + 0x48) = *(undefined4 *)((long)d3 + lVar22);
                *(undefined4 *)((long)pvVar13 + lVar22 + 0x60) = *(undefined4 *)((long)d4 + lVar22);
                *(undefined4 *)((long)pvVar13 + lVar22 + 0x78) = *(undefined4 *)((long)d5 + lVar22);
                lVar22 = lVar22 + 4;
              } while (lVar22 != 0x18);
              lVar20 = lVar20 + 0x10;
              pvVar13 = (void *)((long)pvVar13 + 0x90);
              uVar29 = uVar29 + 1;
            } while (uVar29 != uVar24);
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar23);
      }
      local_3f8 = (void *)((long)local_3f8 + 1);
    } while (local_3f8 != (void *)(ulong)(uint)uVar11);
  }
  top_blob_bordered.elemsize._0_4_ = 0;
  top_blob_bordered.elemsize._4_4_ = 0;
  top_blob_bordered.packing = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  piVar18 = (int *)CONCAT44(local_328._12_4_,local_328._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_328._32_8_ == (Allocator *)0x0) {
        if ((void *)local_328._0_8_ != (void *)0x0) {
          free((void *)local_328._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_328._32_8_ + 0x18))();
      }
    }
  }
  piVar18 = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,top_blob_bordered.refcount._0_4_);
  local_328._0_8_ = top_blob_bordered.data;
  local_328._8_4_ = top_blob_bordered.refcount._0_4_;
  local_328._12_4_ = top_blob_bordered.refcount._4_4_;
  local_328._16_8_ =
       CONCAT44(top_blob_bordered.elemsize._4_4_,(undefined4)top_blob_bordered.elemsize);
  local_328._24_4_ = top_blob_bordered.packing;
  local_328._32_8_ = top_blob_bordered.allocator;
  local_328._44_4_ = top_blob_bordered.w;
  local_328._40_4_ = top_blob_bordered.dims;
  local_328._48_4_ = top_blob_bordered.h;
  local_328._52_4_ = top_blob_bordered.c;
  local_2f0 = top_blob_bordered.cstep;
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (top_blob_bordered.allocator == (Allocator *)0x0) {
        if (top_blob_bordered.data != (void *)0x0) {
          free(top_blob_bordered.data);
        }
      }
      else {
        (**(code **)(*(long *)top_blob_bordered.allocator + 0x18))();
      }
    }
  }
  top_blob_bordered.elemsize._0_4_ = 0;
  top_blob_bordered.elemsize._4_4_ = 0;
  top_blob_bordered.packing = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  pAVar8 = opt->workspace_allocator;
  lVar33 = ((long)(int)(uVar16 * 0x24) & 0x3ffffffffffffffcU) * (long)(int)uVar5;
  if (lVar33 == 0) {
    local_400 = (void *)0x0;
    local_3d0 = (int *)0x0;
  }
  else {
    if (pAVar8 == (Allocator *)0x0) {
      top_blob_bordered.data = (void *)0x0;
      iVar35 = posix_memalign(&top_blob_bordered.data,0x10,lVar33 * 4 + 4);
      local_400 = top_blob_bordered.data;
      if (iVar35 != 0) {
        top_blob_bordered.data = (void *)0x0;
        local_400 = top_blob_bordered.data;
      }
    }
    else {
      local_400 = (void *)(**(code **)(*(long *)pAVar8 + 0x10))(pAVar8);
    }
    local_3d0 = (int *)((long)local_400 + lVar33 * 4);
    *(undefined4 *)((long)local_400 + lVar33 * 4) = 1;
  }
  if (0 < (int)uVar5) {
    iVar35 = kernel_tm->w;
    local_3f8 = kernel_tm->data;
    sVar9 = kernel_tm->elemsize;
    sVar10 = kernel_tm->cstep;
    uVar23 = 0;
    local_3b0 = local_400;
    do {
      if (0 < (int)uVar16) {
        uVar28 = 0;
        pvVar13 = local_410;
        pvVar30 = local_3b0;
        do {
          memset(&top_blob_bordered,0,0x90);
          if (0 < (int)uVar11) {
            uVar21 = 0;
            pvVar14 = pvVar13;
            pvVar19 = local_3f8;
            do {
              lVar33 = 0;
              do {
                *(float *)((long)&top_blob_bordered.data + lVar33 * 4) =
                     *(float *)((long)pvVar19 + lVar33 * 4) * *(float *)((long)pvVar14 + lVar33 * 4)
                     + *(float *)((long)&top_blob_bordered.data + lVar33 * 4);
                lVar33 = lVar33 + 1;
              } while (lVar33 != 0x24);
              uVar21 = uVar21 + 1;
              pvVar19 = (void *)((long)pvVar19 + (long)iVar35 * sVar9);
              pvVar14 = (void *)((long)pvVar14 + uVar32 * 4);
            } while (uVar21 != (uint)uVar11);
          }
          lVar33 = 0;
          do {
            *(undefined4 *)((long)pvVar30 + lVar33 * 4) =
                 *(undefined4 *)((long)&top_blob_bordered.data + lVar33 * 4);
            lVar33 = lVar33 + 1;
          } while (lVar33 != 0x24);
          uVar28 = uVar28 + 1;
          pvVar13 = (void *)((long)pvVar13 + 0x90);
          pvVar30 = (void *)((long)pvVar30 + 0x90);
        } while (uVar28 != uVar16);
      }
      uVar23 = uVar23 + 1;
      local_3f8 = (void *)((long)local_3f8 + sVar9 * sVar10);
      local_3b0 = (void *)((long)local_3b0 + uVar32 * 4);
    } while (uVar23 != uVar5);
  }
  top_blob_bordered.elemsize._0_4_ = 0;
  top_blob_bordered.elemsize._4_4_ = 0;
  top_blob_bordered.packing = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  if (local_3e8 != (int *)0x0) {
    LOCK();
    *local_3e8 = *local_3e8 + -1;
    UNLOCK();
    if (*local_3e8 == 0) {
      if (pAVar7 == (Allocator *)0x0) {
        if (local_410 != (void *)0x0) {
          free(local_410);
        }
      }
      else {
        (**(code **)(*(long *)pAVar7 + 0x18))(pAVar7,local_410);
      }
    }
  }
  pAVar7 = top_blob_bordered.allocator;
  pvVar13 = top_blob_bordered.data;
  piVar18 = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,top_blob_bordered.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (top_blob_bordered.allocator == (Allocator *)0x0) {
        if (top_blob_bordered.data != (void *)0x0) {
          free(top_blob_bordered.data);
        }
      }
      else {
        (**(code **)(*(long *)top_blob_bordered.allocator + 0x18))();
      }
    }
  }
  top_blob_bordered.elemsize._0_4_ = 0;
  top_blob_bordered.elemsize._4_4_ = 0;
  top_blob_bordered.packing = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  top_blob_bordered.allocator = opt->workspace_allocator;
  auVar12._4_4_ = -(uint)(iVar41 == 0);
  auVar12._0_4_ = -(uint)(iVar40 == 0);
  auVar12._8_4_ = -(uint)(uVar5 == 0);
  auVar12._12_4_ = 0;
  movmskps((int)opt,auVar12 << 0x20);
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  piVar1 = (int *)0x0;
  top_blob_bordered.elemsize._0_4_ = 4;
  top_blob_bordered.elemsize._4_4_ = 0;
  top_blob_bordered.packing = 1;
  top_blob_bordered.dims = 3;
  top_blob_bordered.w = iVar40;
  top_blob_bordered.h = iVar41;
  top_blob_bordered.c = uVar5;
  top_blob_bordered.cstep = (long)(iVar41 * iVar40) & 0x3ffffffffffffff0;
  lVar33 = top_blob_bordered.cstep * (long)(int)uVar5;
  if (lVar33 != 0) {
    sVar2 = lVar33 * 4 + 4;
    if (top_blob_bordered.allocator == (Allocator *)0x0) {
      d1[0] = 0.0;
      d1[1] = 0.0;
      iVar35 = posix_memalign((void **)d1,0x10,sVar2);
      top_blob_bordered.data = (void *)d1._0_8_;
      if (iVar35 != 0) {
        d1[0] = 0.0;
        d1[1] = 0.0;
        top_blob_bordered.data = (void *)d1._0_8_;
      }
    }
    else {
      top_blob_bordered.data =
           (void *)(**(code **)(*(long *)top_blob_bordered.allocator + 0x10))
                             (top_blob_bordered.allocator,sVar2);
    }
    piVar1 = (int *)((long)top_blob_bordered.data + lVar33 * 4);
    top_blob_bordered.refcount._0_4_ = SUB84(piVar1,0);
    top_blob_bordered.refcount._4_4_ = (undefined4)((ulong)piVar1 >> 0x20);
    *(undefined4 *)((long)top_blob_bordered.data + lVar33 * 4) = 1;
  }
  if (0 < (int)uVar5) {
    uVar32 = 1;
    if (1 < (int)uVar36) {
      uVar32 = (ulong)uVar36;
    }
    uVar23 = 1;
    if (1 < (int)uVar39) {
      uVar23 = (ulong)uVar39;
    }
    lVar33 = (long)top_blob_bordered.w *
             CONCAT44(top_blob_bordered.elemsize._4_4_,(undefined4)top_blob_bordered.elemsize);
    uVar28 = 0;
    pvVar30 = local_400;
    do {
      if (pvVar6 == (void *)0x0) {
        fVar42 = 0.0;
      }
      else {
        fVar42 = *(float *)((long)pvVar6 + uVar28 * 4);
      }
      if (0 < (int)uVar4) {
        lVar25 = top_blob_bordered.cstep *
                 CONCAT44(top_blob_bordered.elemsize._4_4_,(undefined4)top_blob_bordered.elemsize) *
                 uVar28;
        uVar21 = 0;
        uVar34 = 0;
        do {
          if (0 < (int)uVar3) {
            pvVar14 = (void *)(uVar21 * 0x90 + (long)pvVar30);
            lVar20 = (long)top_blob_bordered.data + (uVar34 * 4 + 3) * lVar33 + lVar25;
            lVar22 = (long)top_blob_bordered.data + (uVar34 * 4 + 2) * lVar33 + lVar25;
            lVar26 = (long)top_blob_bordered.data + (uVar34 * 4 + 1) * lVar33 + lVar25;
            lVar31 = (long)top_blob_bordered.data + uVar34 * 4 * lVar33 + lVar25;
            uVar15 = 0;
            do {
              lVar27 = 0;
              do {
                *(undefined4 *)((long)d1 + lVar27) = *(undefined4 *)((long)pvVar14 + lVar27);
                *(undefined4 *)((long)d2 + lVar27) = *(undefined4 *)((long)pvVar14 + lVar27 + 0x18);
                *(undefined4 *)((long)d3 + lVar27) = *(undefined4 *)((long)pvVar14 + lVar27 + 0x30);
                *(undefined4 *)((long)d4 + lVar27) = *(undefined4 *)((long)pvVar14 + lVar27 + 0x48);
                *(undefined4 *)((long)d5 + lVar27) = *(undefined4 *)((long)pvVar14 + lVar27 + 0x60);
                *(undefined4 *)((long)w0 + lVar27) = *(undefined4 *)((long)pvVar14 + lVar27 + 0x78);
                lVar27 = lVar27 + 4;
              } while (lVar27 != 0x18);
              lVar27 = 0;
              do {
                fVar49 = *(float *)((long)d3 + lVar27) + *(float *)((long)d2 + lVar27);
                fVar50 = *(float *)((long)d4 + lVar27) + *(float *)((long)d5 + lVar27);
                *(float *)((long)w1 + lVar27) = *(float *)((long)d1 + lVar27) + fVar49 + fVar50;
                fVar43 = *(float *)((long)d4 + lVar27) - *(float *)((long)d5 + lVar27);
                fVar44 = *(float *)((long)d2 + lVar27) - *(float *)((long)d3 + lVar27);
                *(float *)((long)w2 + lVar27) = fVar43 + fVar43 + fVar44;
                *(float *)((long)w3 + lVar27) = fVar50 * 4.0 + fVar49;
                *(float *)((long)w4 + lVar27) =
                     fVar43 * 8.0 + fVar44 + *(float *)((long)w0 + lVar27);
                lVar27 = lVar27 + 4;
              } while (lVar27 != 0x18);
              fVar43 = w1[1] + fVar42;
              fVar44 = w2[1] + fVar42;
              fVar49 = w3[1] + fVar42;
              fVar50 = w4[1] + fVar42;
              w5[0] = w1[0] + w1[2] + fVar43 + w1[3] + w1[4];
              w5[1] = w2[0] + w2[2] + fVar44 + w2[3] + w2[4];
              w5[2] = w3[0] + w3[2] + fVar49 + w3[3] + w3[4];
              w5[3] = w4[0] + w4[2] + fVar50 + w4[3] + w4[4];
              fVar45 = w1[3] - w1[4];
              fVar46 = w2[3] - w2[4];
              fVar47 = w3[3] - w3[4];
              fVar48 = w4[3] - w4[4];
              t0[0] = fVar45 + fVar45 + (fVar43 - w1[2]);
              t0[1] = fVar46 + fVar46 + (fVar44 - w2[2]);
              t0[2] = fVar47 + fVar47 + (fVar49 - w3[2]);
              t0[3] = fVar48 + fVar48 + (fVar50 - w4[2]);
              t1[0] = w1[2] + fVar43 + (w1[3] + w1[4]) * 4.0;
              t1[1] = w2[2] + fVar44 + (w2[3] + w2[4]) * 4.0;
              t1[2] = w3[2] + fVar49 + (w3[3] + w3[4]) * 4.0;
              t1[3] = w4[2] + fVar50 + (w4[3] + w4[4]) * 4.0;
              t2[0] = (fVar43 - w1[2]) + w1[5] + fVar45 * 8.0;
              t2[1] = (fVar44 - w2[2]) + w2[5] + fVar46 * 8.0;
              t2[2] = (fVar49 - w3[2]) + w3[5] + fVar47 * 8.0;
              t2[3] = (fVar50 - w4[2]) + w4[5] + fVar48 * 8.0;
              lVar27 = 0;
              do {
                *(undefined4 *)(lVar31 + lVar27) = *(undefined4 *)((long)w5 + lVar27);
                *(undefined4 *)(lVar26 + lVar27) = *(undefined4 *)((long)t0 + lVar27);
                *(undefined4 *)(lVar22 + lVar27) = *(undefined4 *)((long)t1 + lVar27);
                *(undefined4 *)(lVar20 + lVar27) = *(undefined4 *)((long)t2 + lVar27);
                lVar27 = lVar27 + 4;
              } while (lVar27 != 0x10);
              lVar31 = lVar31 + 0x10;
              lVar26 = lVar26 + 0x10;
              lVar22 = lVar22 + 0x10;
              lVar20 = lVar20 + 0x10;
              uVar15 = uVar15 + 1;
              pvVar14 = (void *)((long)pvVar14 + 0x90);
            } while (uVar15 != uVar32);
          }
          uVar34 = uVar34 + 1;
          uVar21 = (ulong)((int)uVar21 + uVar36);
        } while (uVar34 != uVar23);
      }
      uVar28 = uVar28 + 1;
      pvVar30 = (void *)((long)pvVar30 + (long)(int)(uVar16 * 0x24) * 4);
    } while (uVar28 != uVar5);
  }
  top_blob_bordered.refcount = piVar1;
  copy_cut_border(&top_blob_bordered,top_blob,0,top_blob_bordered.h - top_blob->h,0,
                  top_blob_bordered.w - top_blob->w,opt->blob_allocator,opt->num_threads);
  if (top_blob_bordered.refcount != (int *)0x0) {
    LOCK();
    *top_blob_bordered.refcount = *top_blob_bordered.refcount + -1;
    UNLOCK();
    if (*top_blob_bordered.refcount == 0) {
      if (top_blob_bordered.allocator == (Allocator *)0x0) {
        if (top_blob_bordered.data != (void *)0x0) {
          free(top_blob_bordered.data);
        }
      }
      else {
        (**(code **)(*(long *)top_blob_bordered.allocator + 0x18))();
      }
    }
  }
  top_blob_bordered.elemsize._0_4_ = 0;
  top_blob_bordered.elemsize._4_4_ = 0;
  top_blob_bordered.packing = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  if (local_3d0 != (int *)0x0) {
    LOCK();
    *local_3d0 = *local_3d0 + -1;
    UNLOCK();
    if (*local_3d0 == 0) {
      if (pAVar8 == (Allocator *)0x0) {
        if (local_400 != (void *)0x0) {
          free(local_400);
        }
      }
      else {
        (**(code **)(*(long *)pAVar8 + 0x18))(pAVar8,local_400);
      }
    }
  }
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (pAVar7 == (Allocator *)0x0) {
        if (pvVar13 != (void *)0x0) {
          free(pvVar13);
        }
      }
      else {
        (**(code **)(*(long *)pAVar7 + 0x18))();
      }
    }
  }
  piVar18 = (int *)CONCAT44(local_328._12_4_,local_328._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_328._32_8_ == (Allocator *)0x0) {
        if ((void *)local_328._0_8_ != (void *)0x0) {
          free((void *)local_328._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_328._32_8_ + 0x18))();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2, winograd F(4,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt.workspace_allocator, opt.num_threads);

    const float* bias = _bias;    

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(6*6, tiles, inch, 4u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {4.0f, 0.0f, -5.0f, 0.0f, 1.0f, 0.0f},
        //     {0.0f,-4.0f, -4.0f, 1.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f, -4.0f,-1.0f, 1.0f, 0.0f},
        //     {0.0f,-2.0f, -1.0f, 2.0f, 1.0f, 0.0f},
        //     {0.0f, 2.0f, -1.0f,-2.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f,  0.0f,-5.0f, 0.0f, 1.0f}
        // };

		// 0 =	4 * r00  - 5 * r02	+ r04
        // 1 = -4 * (r01 + r02)  + r03 + r04
        // 2 =	4 * (r01 - r02)  - r03 + r04
        // 3 = -2 * r01 - r02 + 2 * r03 + r04
        // 4 =	2 * r01 - r02 - 2 * r03 + r04
		// 5 =	4 * r01 - 5 * r03 + r05

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<inch; q++)
        {
            const float* img = bottom_blob_bordered.channel(q);
            float* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const float* r0 = img + w * j * 4;
                const float* r1 = r0 + w;
                const float* r2 = r1 + w;
                const float* r3 = r2 + w;
                const float* r4 = r3 + w;
                const float* r5 = r4 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    float d0[6],d1[6],d2[6],d3[6],d4[6],d5[6];
                    float w0[6],w1[6],w2[6],w3[6],w4[6],w5[6];
                    float t0[6],t1[6],t2[6],t3[6],t4[6],t5[6];

                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                        d4[n] = r4[n];
                        d5[n] = r5[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 6; n++)
                    {   
                        w0[n] =  4*d0[n]          - 5*d2[n]           + d4[n];
                        w1[n] =          -4*d1[n] - 4*d2[n] +   d3[n] + d4[n];
                        w2[n] =           4*d1[n] - 4*d2[n] -   d3[n] + d4[n];
                        w3[n] =          -2*d1[n] -   d2[n] + 2*d3[n] + d4[n];
                        w4[n] =           2*d1[n] -   d2[n] - 2*d3[n] + d4[n];
                        w5[n] =           4*d1[n]           - 5*d3[n]          + d5[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0]=w0[0]; t1[0]=w0[1]; t2[0]=w0[2]; t3[0]=w0[3]; t4[0]=w0[4]; t5[0]=w0[5];
                        t0[1]=w1[0]; t1[1]=w1[1]; t2[1]=w1[2]; t3[1]=w1[3]; t4[1]=w1[4]; t5[1]=w1[5];
                        t0[2]=w2[0]; t1[2]=w2[1]; t2[2]=w2[2]; t3[2]=w2[3]; t4[2]=w2[4]; t5[2]=w2[5];
                        t0[3]=w3[0]; t1[3]=w3[1]; t2[3]=w3[2]; t3[3]=w3[3]; t4[3]=w3[4]; t5[3]=w3[5];
                        t0[4]=w4[0]; t1[4]=w4[1]; t2[4]=w4[2]; t3[4]=w4[3]; t4[4]=w4[4]; t5[4]=w4[5];
                        t0[5]=w5[0]; t1[5]=w5[1]; t2[5]=w5[2]; t3[5]=w5[3]; t4[5]=w5[4]; t5[5]=w5[5];
                    }                   
                    // d = B_t * d_t
                    for (int n = 0; n < 6; n++)
                    {   
                        d0[n] =  4*t0[n]           - 5*t2[n]           + t4[n];
                        d1[n] =          - 4*t1[n] - 4*t2[n] +   t3[n] + t4[n];
                        d2[n] =            4*t1[n] - 4*t2[n] -   t3[n] + t4[n];
                        d3[n] =          - 2*t1[n] -   t2[n] + 2*t3[n] + t4[n];
                        d4[n] =            2*t1[n] -   t2[n] - 2*t3[n] + t4[n];
                        d5[n] =            4*t1[n]           - 5*t3[n]          + t5[n];
                    }                   
                    // save to out_tm
                    for (int n = 0; n < 6; n++)
                    {
                        out_tm0[n   ] = d0[n];
                        out_tm0[n+ 6] = d1[n];
                        out_tm0[n+12] = d2[n];
                        out_tm0[n+18] = d3[n];
                        out_tm0[n+24] = d4[n];
                        out_tm0[n+30] = d5[n];
                    }

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    r3 += 4;
                    r4 += 4;
                    r5 += 4;

                    out_tm0 += 36;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks; 

        top_blob_tm.create(36, tiles, outch, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i=0; i<tiles; i++)
            {
                float* output0_tm = out0_tm.row(i);

                float sum0[36] = {0.0f};

                for (int q=0; q<inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* k0 = kernel0_tm.row(q);

                    for (int n=0; n<36; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                    }                                
                }                  

                for (int n=0; n<36; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[4][6] = {
        //     {1.0f, 1.0f,  1.0f, 1.0f,  1.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 2.0f, -2.0f, 0.0f},
        //     {0.0f, 1.0f,  1.0f, 4.0f,  4.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 8.0f, -8.0f, 1.0f}
        // };

        // 0 =	r00 + r01 + r02 + r03 +	r04
        // 1 =		  r01 - r02 + 2 * (r03 - r04)
        // 2 =		  r01 + r02 + 4 * (r03 + r04)
        // 3 =		  r01 - r02 + 8 * (r03 - r04)  + r05
        

        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            const float bias0 = bias ? bias[p] : 0.f;

            for (int j=0; j<nColBlocks; j++)
            {
                float* outRow0 = out.row(j*4);
                float* outRow1 = out.row(j*4+1);
                float* outRow2 = out.row(j*4+2);
                float* outRow3 = out.row(j*4+3);                

                for(int i=0; i<nRowBlocks; i++)
                {
                    float* out_tile = out_tm.row(j*nRowBlocks + i);

                    float s0[6],s1[6],s2[6],s3[6],s4[6],s5[6];
                    float w0[6],w1[6],w2[6],w3[6];
                    float d0[4],d1[4],d2[4],d3[4],d4[4],d5[4];
                    float o0[4],o1[4],o2[4],o3[4];
                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n+ 6];
                        s2[n] = out_tile[n+12];
                        s3[n] = out_tile[n+18];
                        s4[n] = out_tile[n+24];
                        s5[n] = out_tile[n+30];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 6; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n] +   s3[n] +   s4[n];
                        w1[n] =         s1[n] - s2[n] + 2*s3[n] - 2*s4[n];
                        w2[n] =         s1[n] + s2[n] + 4*s3[n] + 4*s4[n];
                        w3[n] =         s1[n] - s2[n] + 8*s3[n] - 8*s4[n] + s5[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0]; d0[1] = w1[0]; d0[2] = w2[0]; d0[3] = w3[0];
                        d1[0] = w0[1]; d1[1] = w1[1]; d1[2] = w2[1]; d1[3] = w3[1];
                        d2[0] = w0[2]; d2[1] = w1[2]; d2[2] = w2[2]; d2[3] = w3[2];
                        d3[0] = w0[3]; d3[1] = w1[3]; d3[2] = w2[3]; d3[3] = w3[3];
                        d4[0] = w0[4]; d4[1] = w1[4]; d4[2] = w2[4]; d4[3] = w3[4];
                        d5[0] = w0[5]; d5[1] = w1[5]; d5[2] = w2[5]; d5[3] = w3[5];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 4; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n] +   d3[n] +   d4[n]         + bias0;
                        o1[n] =         d1[n] - d2[n] + 2*d3[n] - 2*d4[n]         + bias0;
                        o2[n] =         d1[n] + d2[n] + 4*d3[n] + 4*d4[n]         + bias0;
                        o3[n] =         d1[n] - d2[n] + 8*d3[n] - 8*d4[n] + d5[n] + bias0;
                    }
                    // save to top blob tm
                    for (int n = 0; n < 4; n++)
                    {
                        outRow0[n] = o0[n];
                        outRow1[n] = o1[n];
                        outRow2[n] = o2[n];
                        outRow3[n] = o3[n];
                    }                    

                    outRow0 += 4;
                    outRow1 += 4;   
                    outRow2 += 4;
                    outRow3 += 4;                        
                }
            }
        }        
    }
    // END transform output 

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt.blob_allocator, opt.num_threads);
}